

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void getChromaticities(char *attrName,int argc,char **argv,int *i,int part,SetAttrVector *attrs)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TypedAttribute<Imf_3_2::Chromaticities> *this;
  invalid_argument *this_00;
  double dVar2;
  allocator<char> local_81;
  long *local_80;
  long local_78;
  long local_70 [2];
  SetAttr local_60;
  
  if (*i <= argc + -9) {
    this = (TypedAttribute<Imf_3_2::Chromaticities> *)operator_new(0x28);
    Imf_3_2::TypedAttribute<Imf_3_2::Chromaticities>::TypedAttribute(this);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,attrName,&local_81);
    paVar1 = &local_60.name.field_2;
    local_60.name._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_60,local_80,local_78 + (long)local_80);
    local_60.part = part;
    local_60.attr = (Attribute *)this;
    std::vector<SetAttr,_std::allocator<SetAttr>_>::emplace_back<SetAttr>(attrs,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60.name._M_dataplus._M_p != paVar1) {
      operator_delete(local_60.name._M_dataplus._M_p,local_60.name.field_2._M_allocated_capacity + 1
                     );
    }
    if (local_80 != local_70) {
      operator_delete(local_80,local_70[0] + 1);
    }
    dVar2 = strtod(argv[(long)*i + 1],(char **)0x0);
    *(float *)(this + 8) = (float)dVar2;
    dVar2 = strtod(argv[(long)*i + 2],(char **)0x0);
    *(float *)(this + 0xc) = (float)dVar2;
    dVar2 = strtod(argv[(long)*i + 3],(char **)0x0);
    *(float *)(this + 0x10) = (float)dVar2;
    dVar2 = strtod(argv[(long)*i + 4],(char **)0x0);
    *(float *)(this + 0x14) = (float)dVar2;
    dVar2 = strtod(argv[(long)*i + 5],(char **)0x0);
    *(float *)(this + 0x18) = (float)dVar2;
    dVar2 = strtod(argv[(long)*i + 6],(char **)0x0);
    *(float *)(this + 0x1c) = (float)dVar2;
    dVar2 = strtod(argv[(long)*i + 7],(char **)0x0);
    *(float *)(this + 0x20) = (float)dVar2;
    dVar2 = strtod(argv[(long)*i + 8],(char **)0x0);
    *(float *)(this + 0x24) = (float)dVar2;
    *i = *i + 9;
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"Expected 8 chromaticity values");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void
getChromaticities (
    const char     attrName[],
    int            argc,
    char**         argv,
    int&           i,
    int            part,
    SetAttrVector& attrs)
{
    if (i > argc - 9)
        throw invalid_argument("Expected 8 chromaticity values");

    ChromaticitiesAttribute* a = new ChromaticitiesAttribute;
    attrs.push_back (SetAttr (attrName, part, a));

    a->value ().red.x   = static_cast<float> (strtod (argv[i + 1], 0));
    a->value ().red.y   = static_cast<float> (strtod (argv[i + 2], 0));
    a->value ().green.x = static_cast<float> (strtod (argv[i + 3], 0));
    a->value ().green.y = static_cast<float> (strtod (argv[i + 4], 0));
    a->value ().blue.x  = static_cast<float> (strtod (argv[i + 5], 0));
    a->value ().blue.y  = static_cast<float> (strtod (argv[i + 6], 0));
    a->value ().white.x = static_cast<float> (strtod (argv[i + 7], 0));
    a->value ().white.y = static_cast<float> (strtod (argv[i + 8], 0));
    i += 9;
}